

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O1

void __thiscall Disk::Disk(Disk *this,Format *fmt_)

{
  _Rb_tree_header *p_Var1;
  Encoding EVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  FdcType FVar14;
  DataRate DVar15;
  uint8_t uVar16;
  bool bVar17;
  undefined2 uVar18;
  Data local_48;
  
  this->_vptr_Disk = (_func_int **)&PTR__Disk_001dbf20;
  iVar13 = fmt_->heads;
  FVar14 = fmt_->fdc;
  DVar15 = fmt_->datarate;
  EVar2 = fmt_->encoding;
  iVar3 = fmt_->sectors;
  iVar4 = fmt_->size;
  iVar5 = fmt_->base;
  iVar6 = fmt_->offset;
  iVar7 = fmt_->interleave;
  iVar8 = fmt_->skew;
  iVar9 = fmt_->head0;
  iVar10 = fmt_->head0;
  iVar11 = fmt_->head1;
  iVar12 = fmt_->gap3;
  uVar16 = fmt_->fill;
  bVar17 = fmt_->cyls_first;
  uVar18 = *(undefined2 *)&fmt_->field_0x3a;
  (this->fmt).cyls = fmt_->cyls;
  (this->fmt).heads = iVar13;
  (this->fmt).fdc = FVar14;
  (this->fmt).datarate = DVar15;
  (this->fmt).encoding = EVar2;
  (this->fmt).sectors = iVar3;
  (this->fmt).size = iVar4;
  (this->fmt).base = iVar5;
  (this->fmt).offset = iVar6;
  (this->fmt).interleave = iVar7;
  (this->fmt).skew = iVar8;
  (this->fmt).head0 = iVar9;
  (this->fmt).head0 = iVar10;
  (this->fmt).head1 = iVar11;
  (this->fmt).gap3 = iVar12;
  (this->fmt).fill = uVar16;
  (this->fmt).cyls_first = bVar17;
  *(undefined2 *)&(this->fmt).field_0x3a = uVar18;
  p_Var1 = &(this->metadata)._M_t._M_impl.super__Rb_tree_header;
  (this->metadata)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->metadata)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->metadata)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->metadata)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->metadata)._M_t._M_impl = 0;
  *(undefined8 *)&(this->metadata)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->metadata)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->metadata)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->metadata)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->strType)._M_dataplus._M_p = (pointer)&(this->strType).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->strType,"<unknown>","");
  p_Var1 = &(this->m_trackdata)._M_t._M_impl.super__Rb_tree_header;
  (this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->m_trackdata)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  *(undefined8 *)((long)&(this->m_trackdata_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_trackdata_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_trackdata_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_trackdata_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_trackdata_mutex).super___mutex_base._M_mutex.__align = 0;
  local_48.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  format(this,&this->fmt,&local_48,false);
  if (local_48.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    return;
  }
  return;
}

Assistant:

Disk::Disk(Format& fmt_)
    : fmt(fmt_)
{
    format(fmt);
}